

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O2

_Bool glsl_attach_shader_source(ALLEGRO_SHADER *shader,ALLEGRO_SHADER_TYPE type,char *source)

{
  long lVar1;
  _Bool _Var2;
  GLuint GVar3;
  ALLEGRO_USTR *pAVar4;
  ulong uVar5;
  char *source_local;
  GLint status;
  GLchar error_buf [4096];
  
  source_local = source;
  al_get_current_display();
  if (source == (char *)0x0) {
    if (type == ALLEGRO_VERTEX_SHADER) {
      _Var2 = true;
      if (*(GLuint *)&shader[1].vertex_copy != 0) {
        (*_al_glDetachShader)(*(GLuint *)&shader[1].pixel_copy,*(GLuint *)&shader[1].vertex_copy);
        (*_al_glDeleteShader)(*(GLuint *)&shader[1].vertex_copy);
        *(undefined4 *)&shader[1].vertex_copy = 0;
      }
    }
    else {
      GVar3 = *(GLuint *)((long)&shader[1].vertex_copy + 4);
      _Var2 = true;
      if (GVar3 != 0) {
        (*_al_glDetachShader)(*(GLuint *)&shader[1].pixel_copy,GVar3);
        (*_al_glDeleteShader)(*(GLuint *)((long)&shader[1].vertex_copy + 4));
        *(undefined4 *)((long)&shader[1].vertex_copy + 4) = 0;
      }
    }
  }
  else {
    uVar5 = (ulong)(type != ALLEGRO_VERTEX_SHADER);
    GVar3 = (*_al_glCreateShader)(type == ALLEGRO_VERTEX_SHADER | 0x8b30);
    *(GLuint *)((long)&shader[1].vertex_copy + uVar5 * 4) = GVar3;
    if (GVar3 != 0) {
      lVar1 = uVar5 * 4;
      (*_al_glShaderSource)(GVar3,1,&source_local,(GLint *)0x0);
      (*_al_glCompileShader)(*(GLuint *)((long)&shader[1].vertex_copy + lVar1));
      (*_al_glGetShaderiv)(*(GLuint *)((long)&shader[1].vertex_copy + lVar1),0x8b81,&status);
      if (status != 0) {
        return true;
      }
      (*_al_glGetShaderInfoLog)
                (*(GLuint *)((long)&shader[1].vertex_copy + lVar1),0x1000,(GLsizei *)0x0,error_buf);
      if (shader->log == (ALLEGRO_USTR *)0x0) {
        pAVar4 = al_ustr_new(error_buf);
        shader->log = pAVar4;
      }
      else {
        al_ustr_truncate(shader->log,0);
        al_ustr_append_cstr(shader->log,error_buf);
      }
      _Var2 = _al_trace_prefix("shader",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/opengl/ogl_shader.c"
                               ,0x8b,"glsl_attach_shader_source");
      if (_Var2) {
        _al_trace_suffix("Compile error: %s\n",error_buf);
      }
      (*_al_glDeleteShader)(*(GLuint *)((long)&shader[1].vertex_copy + lVar1));
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool glsl_attach_shader_source(ALLEGRO_SHADER *shader,
   ALLEGRO_SHADER_TYPE type, const char *source)
{
   GLint status;
   GLchar error_buf[4096];
   ALLEGRO_SHADER_GLSL_S *gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;
   ALLEGRO_DISPLAY *display = al_get_current_display();
   ASSERT(display);
   ASSERT(display->flags & ALLEGRO_OPENGL);

   if (source == NULL) {
      if (type == ALLEGRO_VERTEX_SHADER) {
         if (gl_shader->vertex_shader) {
            glDetachShader(gl_shader->program_object, gl_shader->vertex_shader);
            glDeleteShader(gl_shader->vertex_shader);
            gl_shader->vertex_shader = 0;
         }
      }
      else {
         if (gl_shader->pixel_shader) {
            glDetachShader(gl_shader->program_object, gl_shader->pixel_shader);
            glDeleteShader(gl_shader->pixel_shader);
            gl_shader->pixel_shader = 0;
         }
      }
      return true;
   }
   else {
      GLuint *handle;
      GLenum gl_type;
      if (type == ALLEGRO_VERTEX_SHADER) {
         handle = &(gl_shader->vertex_shader);
         gl_type = GL_VERTEX_SHADER;
      }
      else {
         handle = &(gl_shader->pixel_shader);
         gl_type = GL_FRAGMENT_SHADER;
      }
      *handle = glCreateShader(gl_type);
      if ((*handle) == 0) {
         return false;
      }
      glShaderSource(*handle, 1, &source, NULL);
      glCompileShader(*handle);
      glGetShaderiv(*handle, GL_COMPILE_STATUS, &status);
      if (status == 0) {
         glGetShaderInfoLog(*handle, sizeof(error_buf), NULL, error_buf);
         if (shader->log) {
            al_ustr_truncate(shader->log, 0);
            al_ustr_append_cstr(shader->log, error_buf);
         }
         else {
            shader->log = al_ustr_new(error_buf);
         }
         ALLEGRO_ERROR("Compile error: %s\n", error_buf);
         glDeleteShader(*handle);
         return false;
      }
   }

   return true;
}